

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.h
# Opt level: O2

vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> * __thiscall
winmd::reader::cache::nested_types(cache *this,TypeDef *enclosing_type)

{
  int iVar1;
  const_iterator cVar2;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *pvVar3;
  
  cVar2 = std::
          _Rb_tree<winmd::reader::TypeDef,_std::pair<const_winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<winmd::reader::TypeDef>,_std::allocator<std::pair<const_winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
          ::find(&(this->m_nested_types)._M_t,enclosing_type);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->m_nested_types)._M_t._M_impl.super__Rb_tree_header
     ) {
    pvVar3 = &nested_types::empty;
    if (nested_types(winmd::reader::TypeDef_const&)::empty == '\0') {
      iVar1 = __cxa_guard_acquire(&nested_types(winmd::reader::TypeDef_const&)::empty);
      if (iVar1 != 0) {
        nested_types::empty.
        super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        nested_types::empty.
        super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        nested_types::empty.
        super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar3 = &nested_types::empty;
        __cxa_atexit(std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
                     ~vector,&nested_types::empty,&__dso_handle);
        __cxa_guard_release(&nested_types(winmd::reader::TypeDef_const&)::empty);
      }
    }
  }
  else {
    pvVar3 = (vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
             &cVar2._M_node[1]._M_left;
  }
  return (vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
         (_Base_ptr *)pvVar3;
}

Assistant:

std::vector<TypeDef> const& nested_types(TypeDef const& enclosing_type) const
        {
            auto it = m_nested_types.find(enclosing_type);
            if (it != m_nested_types.end())
            {
                return it->second;
            }
            else
            {
                static const std::vector<TypeDef> empty;
                return empty;
            }
        }